

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::LogFormat::parseFromFormat(LogFormat *this,string_t *userFormat)

{
  pointer pcVar1;
  long lVar2;
  string_t formatCopy;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (userFormat->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + userFormat->_M_string_length);
  this->m_flags = 0;
  lVar2 = -1;
LAB_0015b1ce:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c541,lVar2 + 1), lVar2 == 0) {
LAB_0015b21a:
    if ((this->m_flags >> 0xb & 1) == 0) {
      this->m_flags = this->m_flags | 0x800;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b21a;
    if ((this->m_flags & 0x800) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b1ce;
  }
  lVar2 = -1;
LAB_0015b237:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c546,lVar2 + 1), lVar2 == 0) {
LAB_0015b283:
    if ((this->m_flags >> 0xd & 1) == 0) {
      this->m_flags = this->m_flags | 0x2000;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b283;
    if ((this->m_flags & 0x2000) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b237;
  }
  lVar2 = -1;
LAB_0015b2a0:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c54d,lVar2 + 1), lVar2 == 0) {
LAB_0015b2ec:
    if (-1 < (short)this->m_flags) {
      this->m_flags = this->m_flags | 0x8000;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b2ec;
    if ((this->m_flags & 0x8000) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b2a0;
  }
  lVar2 = -1;
LAB_0015b308:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c557,lVar2 + 1), lVar2 == 0) {
LAB_0015b354:
    if ((this->m_flags & 4) == 0) {
      this->m_flags = this->m_flags | 4;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b354;
    if ((this->m_flags & 4) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b308;
  }
  lVar2 = -1;
LAB_0015b36d:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c55f,lVar2 + 1), lVar2 == 0) {
LAB_0015b3b9:
    if ((this->m_flags >> 0xc & 1) == 0) {
      this->m_flags = this->m_flags | 0x1000;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b3b9;
    if ((this->m_flags & 0x1000) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b36d;
  }
  lVar2 = -1;
LAB_0015b3d6:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c567,lVar2 + 1), lVar2 == 0) {
LAB_0015b422:
    if ((this->m_flags & 8) == 0) {
      this->m_flags = this->m_flags | 8;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b422;
    if ((this->m_flags & 8) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b3d6;
  }
  lVar2 = -1;
LAB_0015b43b:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c56d,lVar2 + 1), lVar2 == 0) {
LAB_0015b487:
    if ((this->m_flags >> 0xe & 1) == 0) {
      this->m_flags = this->m_flags | 0x4000;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b487;
    if ((this->m_flags & 0x4000) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b43b;
  }
  lVar2 = -1;
LAB_0015b4a4:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c574,lVar2 + 1), lVar2 == 0) {
LAB_0015b4f0:
    if ((this->m_flags & 0x10) == 0) {
      this->m_flags = this->m_flags | 0x10;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b4f0;
    if ((this->m_flags & 0x10) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b4a4;
  }
  lVar2 = -1;
LAB_0015b509:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c57a,lVar2 + 1), lVar2 == 0) {
LAB_0015b555:
    if ((this->m_flags & 0x20) == 0) {
      this->m_flags = this->m_flags | 0x20;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b555;
    if ((this->m_flags & 0x20) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b509;
  }
  lVar2 = -1;
LAB_0015b56e:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c57f,lVar2 + 1), lVar2 == 0) {
LAB_0015b5ba:
    if ((this->m_flags & 0x40) == 0) {
      this->m_flags = this->m_flags | 0x40;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b5ba;
    if ((this->m_flags & 0x40) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b56e;
  }
  lVar2 = -1;
LAB_0015b5d3:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c585,lVar2 + 1), lVar2 == 0) {
LAB_0015b61f:
    if (-1 < (char)this->m_flags) {
      this->m_flags = this->m_flags | 0x80;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b61f;
    if ((this->m_flags & 0x80) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b5d3;
  }
  lVar2 = -1;
LAB_0015b63a:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c58b,lVar2 + 1), lVar2 == 0) {
LAB_0015b686:
    if ((this->m_flags >> 8 & 1) == 0) {
      this->m_flags = this->m_flags | 0x100;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b686;
    if ((this->m_flags & 0x100) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b63a;
  }
  lVar2 = -1;
LAB_0015b6a3:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16be0e,lVar2 + 1), lVar2 == 0) {
LAB_0015b6ef:
    if ((this->m_flags >> 9 & 1) == 0) {
      this->m_flags = this->m_flags | 0x200;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b6ef;
    if ((this->m_flags & 0x200) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b6a3;
  }
  lVar2 = -1;
LAB_0015b70c:
  while (lVar2 = std::__cxx11::string::find((char *)local_48,0x16c591,lVar2 + 1), lVar2 == 0) {
LAB_0015b758:
    if ((this->m_flags >> 10 & 1) == 0) {
      this->m_flags = this->m_flags | 0x400;
    }
  }
  if (lVar2 != -1) {
    if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') goto LAB_0015b758;
    if ((this->m_flags & 0x400) != 0) {
      std::__cxx11::string::erase((ulong)local_48,lVar2 - 1);
      lVar2 = lVar2 + 1;
    }
    goto LAB_0015b70c;
  }
  lVar2 = std::__cxx11::string::find((char *)local_48,0x16c599,0);
  if (lVar2 != -1) {
    if (lVar2 != 0) {
      do {
        if (*(char *)((long)local_48[0] + lVar2 + -1) != '%') {
          if (lVar2 == -1) goto LAB_0015b7d9;
          goto LAB_0015b7c6;
        }
        lVar2 = std::__cxx11::string::find((char *)local_48,0x16c599,lVar2 + 1);
      } while (lVar2 != 0);
      lVar2 = 0;
    }
LAB_0015b7c6:
    *(byte *)&this->m_flags = (byte)this->m_flags | 2;
    (*(this->super_Loggable)._vptr_Loggable[3])(this,lVar2,local_48);
  }
LAB_0015b7d9:
  std::__cxx11::string::_M_assign((string *)&this->m_format);
  (*(this->super_Loggable)._vptr_Loggable[4])(this);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void LogFormat::parseFromFormat(const base::type::string_t& userFormat) {
  // We make copy because we will be changing the format
  // i.e, removing user provided date format from original format
  // and then storing it.
  base::type::string_t formatCopy = userFormat;
  m_flags = 0x0;
  auto conditionalAddFlag = [&](const base::type::char_t* specifier, base::FormatFlags flag) {
    std::size_t foundAt = base::type::string_t::npos;
    while ((foundAt = formatCopy.find(specifier, foundAt + 1)) != base::type::string_t::npos) {
      if (foundAt > 0 && formatCopy[foundAt - 1] == base::consts::kFormatSpecifierChar) {
        if (hasFlag(flag)) {
          // If we already have flag we remove the escape chars so that '%%' is turned to '%'
          // even after specifier resolution - this is because we only replaceFirst specifier
          formatCopy.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
          ++foundAt;
        }
      } else {
        if (!hasFlag(flag)) addFlag(flag);
      }
    }
  };
  conditionalAddFlag(base::consts::kAppNameFormatSpecifier, base::FormatFlags::AppName);
  conditionalAddFlag(base::consts::kSeverityLevelFormatSpecifier, base::FormatFlags::Level);
  conditionalAddFlag(base::consts::kSeverityLevelShortFormatSpecifier, base::FormatFlags::LevelShort);
  conditionalAddFlag(base::consts::kLoggerIdFormatSpecifier, base::FormatFlags::LoggerId);
  conditionalAddFlag(base::consts::kThreadIdFormatSpecifier, base::FormatFlags::ThreadId);
  conditionalAddFlag(base::consts::kLogFileFormatSpecifier, base::FormatFlags::File);
  conditionalAddFlag(base::consts::kLogFileBaseFormatSpecifier, base::FormatFlags::FileBase);
  conditionalAddFlag(base::consts::kLogLineFormatSpecifier, base::FormatFlags::Line);
  conditionalAddFlag(base::consts::kLogLocationFormatSpecifier, base::FormatFlags::Location);
  conditionalAddFlag(base::consts::kLogFunctionFormatSpecifier, base::FormatFlags::Function);
  conditionalAddFlag(base::consts::kCurrentUserFormatSpecifier, base::FormatFlags::User);
  conditionalAddFlag(base::consts::kCurrentHostFormatSpecifier, base::FormatFlags::Host);
  conditionalAddFlag(base::consts::kMessageFormatSpecifier, base::FormatFlags::LogMessage);
  conditionalAddFlag(base::consts::kVerboseLevelFormatSpecifier, base::FormatFlags::VerboseLevel);
  // For date/time we need to extract user's date format first
  std::size_t dateIndex = std::string::npos;
  if ((dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier)) != std::string::npos) {
    while (dateIndex > 0 && formatCopy[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
      dateIndex = formatCopy.find(base::consts::kDateTimeFormatSpecifier, dateIndex + 1);
    }
    if (dateIndex != std::string::npos) {
      addFlag(base::FormatFlags::DateTime);
      updateDateFormat(dateIndex, formatCopy);
    }
  }
  m_format = formatCopy;
  updateFormatSpec();
}